

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

_Bool check_frame(cio_websocket_frame_type opcode,char *payload,size_t payload_length,
                 _Bool is_last_frame)

{
  byte bVar1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint8_t mask [4];
  uint_fast32_t aligned_mask;
  undefined4 local_1c;
  ulong local_18;
  size_t sVar5;
  
  sVar7 = write_buffer_parse_pos + 1;
  bVar1 = write_buffer[write_buffer_parse_pos];
  if ((((opcode & ~(uint)bVar1) == CIO_WEBSOCKET_CONTINUATION_FRAME) &&
      (-1 < (char)bVar1 != is_last_frame)) && ((bVar1 & 0x70) == 0)) {
    sVar7 = write_buffer_parse_pos + 2;
    lVar10 = write_buffer_parse_pos + 1;
    uVar4 = write_buffer[lVar10] & 0x7f;
    sVar5 = (size_t)uVar4;
    if (sVar5 == 0x7f) {
      sVar5 = *(size_t *)(write_buffer + write_buffer_parse_pos + 2);
      sVar7 = write_buffer_parse_pos + 10;
    }
    else if (uVar4 == 0x7e) {
      sVar5 = (size_t)*(ushort *)(write_buffer + write_buffer_parse_pos + 2);
      sVar7 = write_buffer_parse_pos + 4;
    }
    if (sVar5 == payload_length) {
      sVar5 = sVar7;
      write_buffer_parse_pos = sVar7;
      if ((char)write_buffer[lVar10] < '\0') {
        puVar3 = write_buffer + sVar7 + 4;
        local_1c = *(undefined4 *)(write_buffer + sVar7);
        sVar5 = sVar7 + 4;
        local_18 = 0;
        write_buffer_parse_pos = sVar5;
        if (payload_length < 8) {
          if (payload_length != 0) {
            sVar7 = 0;
            do {
              puVar3[sVar7] = puVar3[sVar7] ^ *(byte *)((long)&local_1c + (ulong)((uint)sVar7 & 3));
              sVar7 = sVar7 + 1;
            } while (payload_length != sVar7);
          }
        }
        else {
          uVar4 = -(int)puVar3 & 7;
          uVar9 = (ulong)uVar4;
          uVar8 = payload_length - uVar9;
          lVar10 = 0;
          do {
            *(undefined1 *)((long)&local_18 + lVar10) =
                 *(undefined1 *)
                  ((long)&local_1c + (ulong)((-0x160c64 - (int)sVar7) + (int)lVar10 & 3));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          uVar6 = (ulong)((uint)uVar8 & 7);
          if (uVar9 != 0) {
            lVar10 = 0;
            do {
              puVar3[lVar10] =
                   puVar3[lVar10] ^ *(byte *)((long)&local_1c + (ulong)((uint)lVar10 & 3));
              lVar10 = lVar10 + 1;
            } while (uVar4 != (uint)lVar10);
          }
          if (7 < uVar8) {
            uVar11 = 0;
            do {
              *(ulong *)(puVar3 + uVar11 * 8 + uVar9) =
                   *(ulong *)(puVar3 + uVar11 * 8 + uVar9) ^ local_18;
              uVar11 = uVar11 + 1;
            } while (uVar8 >> 3 != uVar11);
          }
          if (payload_length - uVar6 < payload_length) {
            lVar10 = -uVar6;
            do {
              write_buffer[lVar10 + sVar7 + payload_length + 4] =
                   write_buffer[lVar10 + sVar7 + payload_length + 4] ^
                   *(byte *)((long)&local_1c + (ulong)((int)payload_length + (int)lVar10 & 3));
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0);
          }
        }
      }
      if ((payload_length == 0) ||
         (iVar2 = bcmp(write_buffer + sVar5,payload,payload_length), sVar7 = write_buffer_parse_pos,
         iVar2 == 0)) {
        write_buffer_parse_pos = sVar5 + payload_length;
        return true;
      }
    }
  }
  write_buffer_parse_pos = sVar7;
  return false;
}

Assistant:

static bool check_frame(enum cio_websocket_frame_type opcode, const char *payload, size_t payload_length, bool is_last_frame)
{
	uint8_t header = write_buffer[write_buffer_parse_pos++];
	if (((header & WS_HEADER_FIN) == WS_HEADER_FIN) != is_last_frame) {
		return false;
	}

	if ((header & WS_HEADER_RSV) != 0) {
		return false;
	}

	if ((header & opcode) != opcode) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;

	uint64_t length;
	if (first_length == 126) {
		uint16_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be16toh(len);
		length = len;
	} else if (first_length == 127) {
		uint64_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be64toh(len);
		length = len;
	} else {
		length = first_length;
	}

	if (length != payload_length) {
		return false;
	}

	if (is_masked) {
		uint8_t mask[4];
		memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
		write_buffer_parse_pos += sizeof(mask);
		cio_websocket_mask(&write_buffer[write_buffer_parse_pos], (size_t)length, mask);
	}

	if (length > SIZE_MAX) {
		return false;
	}

	if (length > 0) {
		if (memcmp(&write_buffer[write_buffer_parse_pos], payload, (size_t)length) != 0) {
			return false;
		}
	}

	write_buffer_parse_pos += payload_length;

	return true;
}